

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::FileDescriptorProto::MergePartialFromCodedStream
          (FileDescriptorProto *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  DescriptorProto *value;
  EnumDescriptorProto *value_00;
  ServiceDescriptorProto *value_01;
  FieldDescriptorProto *value_02;
  FileOptions *value_03;
  SourceCodeInfo *value_04;
  RepeatedField<int> *pRVar5;
  string *psVar6;
  char *pcVar7;
  UnknownFieldSet *unknown_fields;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  FileDescriptorProto *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
LAB_005148fb:
  do {
    kMax1ByteVarint = 0x7f;
    tag_2 = 0;
    _first_byte_or_zero = input;
    if ((input->buffer_ < input->buffer_end_) &&
       (tag_2 = (uint32)*input->buffer_, '\0' < (char)*input->buffer_)) {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*input->buffer_;
      io::CodedInputStream::Advance(input,1);
      local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_89;
      pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    else {
      local_3c[0] = io::CodedInputStream::ReadTagFallback(input,tag_2);
      local_3d = local_3c[0] - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    tag_00 = local_10;
    if ((uStack_c & 1) == 0) goto switchD_00514b12_default;
    iVar2 = internal::WireFormatLite::GetTagFieldNumber(local_10);
    switch(iVar2) {
    case 1:
      if ((tag_00 & 0xff) != 10) goto switchD_00514b12_default;
      psVar6 = mutable_name_abi_cxx11_(this);
      bVar1 = internal::WireFormatLite::ReadString(input,psVar6);
      if (!bVar1) {
        return false;
      }
      name_abi_cxx11_(this);
      pcVar7 = (char *)std::__cxx11::string::data();
      name_abi_cxx11_(this);
      iVar2 = std::__cxx11::string::length();
      internal::WireFormat::VerifyUTF8StringNamedField
                (pcVar7,iVar2,PARSE,"google.protobuf.FileDescriptorProto.name");
      goto LAB_005148fb;
    case 2:
      if ((tag_00 & 0xff) != 0x12) goto switchD_00514b12_default;
      psVar6 = mutable_package_abi_cxx11_(this);
      bVar1 = internal::WireFormatLite::ReadString(input,psVar6);
      if (!bVar1) {
        return false;
      }
      package_abi_cxx11_(this);
      pcVar7 = (char *)std::__cxx11::string::data();
      package_abi_cxx11_(this);
      iVar2 = std::__cxx11::string::length();
      internal::WireFormat::VerifyUTF8StringNamedField
                (pcVar7,iVar2,PARSE,"google.protobuf.FileDescriptorProto.package");
      goto LAB_005148fb;
    case 3:
      if ((tag_00 & 0xff) != 0x1a) goto switchD_00514b12_default;
      psVar6 = add_dependency_abi_cxx11_(this);
      bVar1 = internal::WireFormatLite::ReadString(input,psVar6);
      if (!bVar1) {
        return false;
      }
      iVar2 = dependency_size(this);
      dependency_abi_cxx11_(this,iVar2 + -1);
      pcVar7 = (char *)std::__cxx11::string::data();
      iVar2 = dependency_size(this);
      dependency_abi_cxx11_(this,iVar2 + -1);
      iVar2 = std::__cxx11::string::length();
      internal::WireFormat::VerifyUTF8StringNamedField
                (pcVar7,iVar2,PARSE,"google.protobuf.FileDescriptorProto.dependency");
      goto LAB_005148fb;
    case 4:
      if ((tag_00 & 0xff) != 0x22) goto switchD_00514b12_default;
      value = add_message_type(this);
      bVar1 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::DescriptorProto>
                        (input,value);
      break;
    case 5:
      if ((tag_00 & 0xff) != 0x2a) goto switchD_00514b12_default;
      value_00 = add_enum_type(this);
      bVar1 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::EnumDescriptorProto>
                        (input,value_00);
      break;
    case 6:
      if ((tag_00 & 0xff) != 0x32) goto switchD_00514b12_default;
      value_01 = add_service(this);
      bVar1 = internal::WireFormatLite::
              ReadMessageNoVirtual<google::protobuf::ServiceDescriptorProto>(input,value_01);
      break;
    case 7:
      if ((tag_00 & 0xff) != 0x3a) goto switchD_00514b12_default;
      value_02 = add_extension(this);
      bVar1 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::FieldDescriptorProto>
                        (input,value_02);
      break;
    case 8:
      if ((tag_00 & 0xff) != 0x42) goto switchD_00514b12_default;
      value_03 = mutable_options(this);
      bVar1 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::FileOptions>
                        (input,value_03);
      break;
    case 9:
      if ((tag_00 & 0xff) != 0x4a) goto switchD_00514b12_default;
      value_04 = mutable_source_code_info(this);
      bVar1 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::SourceCodeInfo>
                        (input,value_04);
      break;
    case 10:
      if ((tag_00 & 0xff) == 0x50) {
        pRVar5 = mutable_public_dependency(this);
        bVar1 = internal::WireFormatLite::
                ReadRepeatedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (1,0x50,input,pRVar5);
      }
      else {
        if ((tag_00 & 0xff) != 0x52) goto switchD_00514b12_default;
        pRVar5 = mutable_public_dependency(this);
        bVar1 = internal::WireFormatLite::
                ReadPackedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,pRVar5);
      }
      break;
    case 0xb:
      if ((tag_00 & 0xff) == 0x58) {
        pRVar5 = mutable_weak_dependency(this);
        bVar1 = internal::WireFormatLite::
                ReadRepeatedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (1,0x58,input,pRVar5);
      }
      else {
        if ((tag_00 & 0xff) != 0x5a) goto switchD_00514b12_default;
        pRVar5 = mutable_weak_dependency(this);
        bVar1 = internal::WireFormatLite::
                ReadPackedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,pRVar5);
      }
      break;
    case 0xc:
      if ((tag_00 & 0xff) != 0x62) goto switchD_00514b12_default;
      psVar6 = mutable_syntax_abi_cxx11_(this);
      bVar1 = internal::WireFormatLite::ReadString(input,psVar6);
      if (!bVar1) {
        return false;
      }
      syntax_abi_cxx11_(this);
      pcVar7 = (char *)std::__cxx11::string::data();
      syntax_abi_cxx11_(this);
      iVar2 = std::__cxx11::string::length();
      internal::WireFormat::VerifyUTF8StringNamedField
                (pcVar7,iVar2,PARSE,"google.protobuf.FileDescriptorProto.syntax");
      goto LAB_005148fb;
    default:
switchD_00514b12_default:
      if ((tag_00 == 0) ||
         (WVar3 = internal::WireFormatLite::GetTagWireType(tag_00), WVar3 == WIRETYPE_END_GROUP)) {
        return true;
      }
      unknown_fields = mutable_unknown_fields(this);
      bVar1 = internal::WireFormat::SkipField(input,tag_00,unknown_fields);
    }
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool FileDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.FileDescriptorProto)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileDescriptorProto.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string package = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->package().data(), this->package().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileDescriptorProto.package");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string dependency = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_dependency()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->dependency(this->dependency_size() - 1).data(),
            this->dependency(this->dependency_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileDescriptorProto.dependency");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.DescriptorProto message_type = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_message_type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_enum_type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.ServiceDescriptorProto service = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_service()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto extension = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FileOptions options = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(74u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_source_code_info()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int32 public_dependency = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 80u, input, this->mutable_public_dependency())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(82u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_public_dependency())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int32 weak_dependency = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 88u, input, this->mutable_weak_dependency())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(90u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_weak_dependency())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string syntax = 12;
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(98u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_syntax()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->syntax().data(), this->syntax().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileDescriptorProto.syntax");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.FileDescriptorProto)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.FileDescriptorProto)
  return false;
#undef DO_
}